

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  size_type sVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  
  sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,(modifier->_M_dataplus)._M_p,0,modifier->_M_string_length);
  if (sVar7 == 0xffffffffffffffff) {
    return false;
  }
  uVar9 = (ulong)((modifier->_M_dataplus)._M_p[modifier->_M_string_length - 1] != ' ') +
          modifier->_M_string_length + sVar7;
  uVar14 = unit_string->_M_string_length;
  if (uVar9 < uVar14) {
    pcVar3 = (unit_string->_M_dataplus)._M_p;
    do {
      cVar1 = pcVar3[uVar9];
      if (cVar1 != ' ') {
        if (uVar9 == 0xffffffffffffffff) {
          return false;
        }
        bVar15 = cVar1 == check2 || cVar1 == check1;
        if (cVar1 == check2 || cVar1 == check1) {
          pcVar3[uVar9 - 1] = '_';
          uVar14 = unit_string->_M_string_length;
        }
        if (uVar14 < uVar9 || uVar14 - uVar9 == 0) {
          return bVar15;
        }
        pcVar3 = (unit_string->_M_dataplus)._M_p;
        pvVar8 = memchr(pcVar3 + uVar9,0x20,uVar14 - uVar9);
        uVar9 = (long)pvVar8 - (long)pcVar3;
        uVar11 = -(ulong)(pvVar8 == (void *)0x0) | uVar9;
        if (uVar14 <= uVar11) {
          return bVar15;
        }
        cVar1 = pcVar3[uVar11 + 1];
        if (cVar1 == '*') {
          return bVar15;
        }
        if (cVar1 == '/') {
          return bVar15;
        }
        cVar2 = pcVar3[uVar11 - 1];
        bVar13 = cVar2 == '*' || cVar2 == '/';
        if ((cVar2 != '*') && (cVar2 != '/')) {
          bVar16 = true;
          bVar13 = true;
          bVar4 = 1;
          if (cVar2 != '(' && cVar1 != '(') {
            bVar4 = 0;
            if (cVar1 != '-') {
              bVar13 = cVar2 == '-';
              bVar4 = 0;
            }
          }
          if (!(bool)(bVar4 | bVar13)) {
            iVar6 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,uVar11 + 1,2,"of");
            bVar16 = iVar6 == 0;
          }
          bVar16 = (bool)(bVar16 | bVar4 | bVar13);
          bVar13 = true;
          if (!bVar16) {
            bVar13 = (unit_string->_M_dataplus)._M_p[uVar11 + 1] == 'U';
          }
          bVar13 = (bool)(bVar13 | bVar16);
        }
        if (bVar13) goto LAB_00400678;
        uVar14 = unit_string->_M_string_length;
        if (uVar14 == 0) goto LAB_004005cd;
        uVar11 = uVar14;
        if (sVar7 < uVar14 - 1) {
          uVar11 = sVar7 + 1;
        }
        goto LAB_004005a2;
      }
      uVar9 = uVar9 + 1;
    } while (uVar14 != uVar9);
  }
  return false;
LAB_004005cd:
  uVar12 = 0xffffffffffffffff;
  goto LAB_004005d4;
  while (lVar5 = uVar11 - 1, uVar11 = uVar12, (unit_string->_M_dataplus)._M_p[lVar5] != '/') {
LAB_004005a2:
    uVar12 = uVar11 - 1;
    if (uVar11 == 0) goto LAB_004005cd;
  }
LAB_004005d4:
  uVar10 = sVar7 + 1;
  uVar11 = 0xffffffffffffffff;
  if (uVar10 <= uVar14 && uVar14 - uVar10 != 0) {
    pcVar3 = (unit_string->_M_dataplus)._M_p;
    pvVar8 = memchr(pcVar3 + uVar10,0x2f,uVar14 - uVar10);
    uVar11 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)pcVar3;
  }
  if (uVar12 < sVar7) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               uVar12 + 1,1,'(');
    uVar9 = uVar9 + 1;
    if (uVar11 == 0xffffffffffffffff) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,')'
               );
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 uVar11 + 1,1,')');
    }
    bVar13 = uVar11 < uVar9;
    bVar15 = true;
  }
  else {
    bVar13 = uVar11 < uVar9;
  }
LAB_00400678:
  if (!bVar13) {
    (unit_string->_M_dataplus)._M_p[uVar9] = '*';
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}